

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O0

int mbedtls_sha256_finish(mbedtls_sha256_context *ctx,uchar *output)

{
  uint uVar1;
  uint uVar2;
  uint *in_RSI;
  void *in_RDI;
  int truncated;
  uint32_t low;
  uint32_t high;
  uint32_t used;
  int ret;
  uchar *in_stack_00000068;
  mbedtls_sha256_context *in_stack_00000070;
  int local_b4;
  
  uVar1 = *(uint *)((long)in_RDI + 0x40) & 0x3f;
  uVar2 = uVar1 + 1;
  *(undefined1 *)((long)in_RDI + (ulong)uVar1) = 0x80;
  if (uVar2 < 0x39) {
    memset((void *)((long)in_RDI + (ulong)uVar2),0,(ulong)(0x38 - uVar2));
  }
  else {
    memset((void *)((long)in_RDI + (ulong)uVar2),0,(ulong)(0x40 - uVar2));
    local_b4 = mbedtls_internal_sha256_process(in_stack_00000070,in_stack_00000068);
    if (local_b4 != 0) goto LAB_02736e86;
    memset(in_RDI,0,0x38);
  }
  uVar2 = *(int *)((long)in_RDI + 0x44) << 3;
  uVar1 = *(int *)((long)in_RDI + 0x40) << 3;
  *(uint *)((long)in_RDI + 0x38) =
       uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
       (*(uint *)((long)in_RDI + 0x40) >> 0x1d | uVar2) << 0x18;
  *(uint *)((long)in_RDI + 0x3c) =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
       *(int *)((long)in_RDI + 0x40) << 0x1b;
  local_b4 = mbedtls_internal_sha256_process(in_stack_00000070,in_stack_00000068);
  if (local_b4 == 0) {
    uVar1 = *(uint *)((long)in_RDI + 0x48);
    *in_RSI = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = *(uint *)((long)in_RDI + 0x4c);
    in_RSI[1] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = *(uint *)((long)in_RDI + 0x50);
    in_RSI[2] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = *(uint *)((long)in_RDI + 0x54);
    in_RSI[3] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = *(uint *)((long)in_RDI + 0x58);
    in_RSI[4] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = *(uint *)((long)in_RDI + 0x5c);
    in_RSI[5] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = *(uint *)((long)in_RDI + 0x60);
    in_RSI[6] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = *(uint *)((long)in_RDI + 100);
    in_RSI[7] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    local_b4 = 0;
  }
LAB_02736e86:
  mbedtls_sha256_free((mbedtls_sha256_context *)0x2736e90);
  return local_b4;
}

Assistant:

int mbedtls_sha256_finish(mbedtls_sha256_context *ctx,
                          unsigned char *output)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    uint32_t used;
    uint32_t high, low;
    int truncated = 0;

    /*
     * Add padding: 0x80 then 0x00 until 8 bytes remain for the length
     */
    used = ctx->total[0] & 0x3F;

    ctx->buffer[used++] = 0x80;

    if (used <= 56) {
        /* Enough room for padding + length in current block */
        memset(ctx->buffer + used, 0, 56 - used);
    } else {
        /* We'll need an extra block */
        memset(ctx->buffer + used, 0, SHA256_BLOCK_SIZE - used);

        if ((ret = mbedtls_internal_sha256_process(ctx, ctx->buffer)) != 0) {
            goto exit;
        }

        memset(ctx->buffer, 0, 56);
    }

    /*
     * Add message length
     */
    high = (ctx->total[0] >> 29)
           | (ctx->total[1] <<  3);
    low  = (ctx->total[0] <<  3);

    MBEDTLS_PUT_UINT32_BE(high, ctx->buffer, 56);
    MBEDTLS_PUT_UINT32_BE(low,  ctx->buffer, 60);

    if ((ret = mbedtls_internal_sha256_process(ctx, ctx->buffer)) != 0) {
        goto exit;
    }

    /*
     * Output final state
     */
    MBEDTLS_PUT_UINT32_BE(ctx->state[0], output,  0);
    MBEDTLS_PUT_UINT32_BE(ctx->state[1], output,  4);
    MBEDTLS_PUT_UINT32_BE(ctx->state[2], output,  8);
    MBEDTLS_PUT_UINT32_BE(ctx->state[3], output, 12);
    MBEDTLS_PUT_UINT32_BE(ctx->state[4], output, 16);
    MBEDTLS_PUT_UINT32_BE(ctx->state[5], output, 20);
    MBEDTLS_PUT_UINT32_BE(ctx->state[6], output, 24);

#if defined(MBEDTLS_SHA224_C)
    truncated = ctx->is224;
#endif
    if (!truncated) {
        MBEDTLS_PUT_UINT32_BE(ctx->state[7], output, 28);
    }

    ret = 0;

exit:
    mbedtls_sha256_free(ctx);
    return ret;
}